

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inversion.hpp
# Opt level: O0

RealType __thiscall OpenMD::Inversion::getValue(Inversion *this,int snapshotNo)

{
  undefined4 in_ESI;
  Vector<double,_3U> *in_RDI;
  double dVar1;
  RealType cos_phi;
  Vector3d B;
  Vector3d A;
  Vector3d r43;
  Vector3d r23;
  Vector3d r31;
  Vector3d pos4;
  Vector3d pos3;
  Vector3d pos2;
  Vector3d pos1;
  Vector<double,_3U> *in_stack_fffffffffffffeb8;
  Vector<double,_3U> *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  StuntDouble *in_stack_fffffffffffffed8;
  Vector3<double> *in_stack_ffffffffffffff20;
  Vector3<double> *in_stack_ffffffffffffff28;
  Vector3d *in_stack_ffffffffffffff38;
  Snapshot *in_stack_ffffffffffffff40;
  
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI->data_ + 2),1);
  StuntDouble::getPos(in_stack_fffffffffffffed8,in_stack_fffffffffffffed4);
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI->data_ + 2),2);
  StuntDouble::getPos(in_stack_fffffffffffffed8,in_stack_fffffffffffffed4);
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI->data_ + 2),0);
  StuntDouble::getPos(in_stack_fffffffffffffed8,in_stack_fffffffffffffed4);
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI->data_ + 2),3);
  StuntDouble::getPos(in_stack_fffffffffffffed8,in_stack_fffffffffffffed4);
  OpenMD::operator-(in_stack_fffffffffffffec8,in_RDI);
  Vector3<double>::Vector3((Vector3<double> *)in_RDI,in_stack_fffffffffffffeb8);
  (**(code **)(*(long *)in_RDI->data_[1] + 0x20))((long *)in_RDI->data_[1],in_ESI);
  Snapshot::wrapVector(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  OpenMD::operator-(in_stack_fffffffffffffec8,in_RDI);
  Vector3<double>::Vector3((Vector3<double> *)in_RDI,in_stack_fffffffffffffeb8);
  (**(code **)(*(long *)in_RDI->data_[1] + 0x20))((long *)in_RDI->data_[1],in_ESI);
  Snapshot::wrapVector(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  OpenMD::operator-(in_stack_fffffffffffffec8,in_RDI);
  Vector3<double>::Vector3((Vector3<double> *)in_RDI,in_stack_fffffffffffffeb8);
  (**(code **)(*(long *)in_RDI->data_[1] + 0x20))((long *)in_RDI->data_[1],in_ESI);
  Snapshot::wrapVector(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  cross<double>(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  cross<double>(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  Vector<double,_3U>::normalize(in_RDI);
  Vector<double,_3U>::normalize(in_RDI);
  dVar1 = dot<double,3u>((Vector<double,_3U> *)
                         CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                         in_stack_fffffffffffffec8);
  if (1.0 < dVar1) {
    dVar1 = 1.0;
  }
  if (dVar1 < -1.0) {
    dVar1 = -1.0;
  }
  dVar1 = acos(dVar1);
  return dVar1;
}

Assistant:

RealType getValue(int snapshotNo) {
      // In OpenMD's version of an inversion, the central atom
      // comes first.  However, to get the planarity in a typical cosine
      // version of this potential (i.e. Amber-style), the central atom
      // is treated as atom *3* in a standard torsion form:

      Vector3d pos1 = atoms_[1]->getPos(snapshotNo);
      Vector3d pos2 = atoms_[2]->getPos(snapshotNo);
      Vector3d pos3 = atoms_[0]->getPos(snapshotNo);
      Vector3d pos4 = atoms_[3]->getPos(snapshotNo);

      Vector3d r31 = pos1 - pos3;
      snapshotMan_->getSnapshot(snapshotNo)->wrapVector(r31);
      Vector3d r23 = pos3 - pos2;
      snapshotMan_->getSnapshot(snapshotNo)->wrapVector(r23);
      Vector3d r43 = pos3 - pos4;
      snapshotMan_->getSnapshot(snapshotNo)->wrapVector(r43);

      //  Calculate the cross products and distances
      Vector3d A = cross(r31, r43);
      Vector3d B = cross(r43, r23);

      A.normalize();
      B.normalize();

      //  Calculate the sin and cos
      RealType cos_phi = dot(A, B);
      if (cos_phi > 1.0) cos_phi = 1.0;
      if (cos_phi < -1.0) cos_phi = -1.0;
      return acos(cos_phi);
    }